

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O1

type boost::make_shared<std::ofstream>(void)

{
  int iVar1;
  undefined4 extraout_var;
  shared_count extraout_RDX;
  element_type *in_RDI;
  type tVar3;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> pt;
  shared_count local_28;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)0x0;
  detail::shared_count::shared_count<std::ofstream*,boost::detail::sp_ms_deleter<std::ofstream>>
            (&local_28,0);
  if (local_28.pi_ != (sp_counted_base *)0x0) {
    iVar1 = (*(local_28.pi_)->_vptr_sp_counted_base[6])();
    puVar2 = (undefined1 *)CONCAT44(extraout_var,iVar1);
  }
  std::ofstream::ofstream((ofstream *)(puVar2 + 8));
  *puVar2 = 1;
  *(ofstream **)in_RDI = (ofstream *)(puVar2 + 8);
  *(sp_counted_base **)(in_RDI + 8) = local_28.pi_;
  if (local_28.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count(&local_28);
  tVar3.pn.pi_ = extraout_RDX.pi_;
  tVar3.px = in_RDI;
  return tVar3;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}